

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.h
# Opt level: O3

int __thiscall
aeron::Subscription::
poll<std::function<void(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
          (Subscription *this,
          function<void_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
          *fragmentHandler,int fragmentLimit)

{
  __pointer_type pIVar1;
  Image *pIVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  exception_handler_t *peVar10;
  uint uVar11;
  int iVar12;
  ReadOutcome readOutcome;
  ReadOutcome local_60;
  AtomicBuffer *local_58;
  ulong local_50;
  function<void_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
  *local_48;
  ulong local_40;
  AtomicBuffer *local_38;
  
  pIVar1 = (this->m_imageList)._M_b._M_p;
  pIVar2 = pIVar1->m_images;
  uVar6 = pIVar1->m_length;
  uVar8 = this->m_roundRobinIndex;
  uVar9 = 0;
  uVar7 = uVar8 + 1;
  if (uVar6 <= uVar8) {
    uVar8 = uVar9;
    uVar7 = uVar9;
  }
  this->m_roundRobinIndex = uVar7;
  local_50 = uVar8;
  local_48 = fragmentHandler;
  if (0 < fragmentLimit && uVar8 < uVar6) {
    peVar10 = &pIVar2[uVar8].m_exceptionHandler;
    uVar9 = 0;
    local_40 = uVar6;
    do {
      uVar8 = uVar8 + 1;
      iVar12 = 0;
      if (((ulong)peVar10[-1]._M_invoker & 1) == 0) {
        local_58 = (AtomicBuffer *)CONCAT44(local_58._4_4_,fragmentLimit - (int)uVar9);
        local_38 = (AtomicBuffer *)((long)&peVar10[-3].super__Function_base._M_functor + 8);
        iVar12 = *(int *)((long)&peVar10[-2].super__Function_base._M_functor + 4);
        concurrent::AtomicBuffer::boundsCheck(local_38,iVar12,8);
        uVar7 = *(ulong *)(peVar10[-3].super__Function_base._M_manager + iVar12);
        uVar6 = uVar7 >> (peVar10[2].super__Function_base._M_functor._M_pod_data[8] & 0x3fU);
        uVar11 = *(uint *)((long)&peVar10[2].super__Function_base._M_functor + 4) & (uint)uVar7;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar6;
        concurrent::logbuffer::TermReader::
        read<std::function<void(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
                  (&local_60,
                   (AtomicBuffer *)
                   ((long)peVar10 +
                   uVar6 * 0x18 +
                   (SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x3ffffffffffffffe) * -0x24 +
                   -0xd0),uVar11,local_48,(int)local_58,(Header *)&peVar10[-5]._M_invoker,peVar10);
        uVar5 = local_60.offset - uVar11;
        uVar6 = local_40;
        iVar12 = local_60.fragmentsRead;
        if (uVar5 != 0 && (int)uVar11 <= local_60.offset) {
          iVar12 = *(int *)((long)&peVar10[-2].super__Function_base._M_functor + 4);
          concurrent::AtomicBuffer::boundsCheck(local_38,iVar12,8);
          *(ulong *)(peVar10[-3].super__Function_base._M_manager + iVar12) = uVar7 + uVar5;
          uVar6 = local_40;
          iVar12 = local_60.fragmentsRead;
        }
      }
      uVar5 = iVar12 + (int)uVar9;
      uVar9 = (ulong)uVar5;
    } while ((uVar8 < uVar6) &&
            (peVar10 = (exception_handler_t *)
                       ((long)&peVar10[9].super__Function_base._M_functor + 8),
            (int)uVar5 < fragmentLimit));
  }
  uVar5 = (uint)uVar9;
  if ((local_50 != 0) && ((int)uVar5 < fragmentLimit)) {
    peVar10 = &pIVar2->m_exceptionHandler;
    uVar6 = 1;
    do {
      iVar12 = 0;
      if (((ulong)peVar10[-1]._M_invoker & 1) == 0) {
        local_58 = (AtomicBuffer *)((long)&peVar10[-3].super__Function_base._M_functor + 8);
        iVar12 = *(int *)((long)&peVar10[-2].super__Function_base._M_functor + 4);
        concurrent::AtomicBuffer::boundsCheck(local_58,iVar12,8);
        uVar8 = *(ulong *)(peVar10[-3].super__Function_base._M_manager + iVar12);
        uVar7 = uVar8 >> (peVar10[2].super__Function_base._M_functor._M_pod_data[8] & 0x3fU);
        uVar11 = *(uint *)((long)&peVar10[2].super__Function_base._M_functor + 4) & (uint)uVar8;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar7;
        concurrent::logbuffer::TermReader::
        read<std::function<void(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
                  (&local_60,
                   (AtomicBuffer *)
                   ((long)peVar10 +
                   uVar7 * 0x18 +
                   (SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x3ffffffffffffffe) * -0x24 +
                   -0xd0),uVar11,local_48,fragmentLimit - (int)uVar9,
                   (Header *)&peVar10[-5]._M_invoker,peVar10);
        uVar5 = local_60.offset - uVar11;
        iVar12 = local_60.fragmentsRead;
        if (uVar5 != 0 && (int)uVar11 <= local_60.offset) {
          iVar12 = *(int *)((long)&peVar10[-2].super__Function_base._M_functor + 4);
          concurrent::AtomicBuffer::boundsCheck(local_58,iVar12,8);
          *(ulong *)(peVar10[-3].super__Function_base._M_manager + iVar12) = uVar8 + uVar5;
          iVar12 = local_60.fragmentsRead;
        }
      }
      uVar5 = iVar12 + (int)uVar9;
      if (local_50 <= uVar6) {
        return uVar5;
      }
      uVar6 = uVar6 + 1;
      peVar10 = (exception_handler_t *)((long)&peVar10[9].super__Function_base._M_functor + 8);
      uVar9 = (ulong)uVar5;
    } while ((int)uVar5 < fragmentLimit);
  }
  return uVar5;
}

Assistant:

inline int poll(F&& fragmentHandler, int fragmentLimit)
    {
        const struct ImageList *imageList = std::atomic_load_explicit(&m_imageList, std::memory_order_acquire);
        const std::size_t length = imageList->m_length;
        Image *images = imageList->m_images;
        int fragmentsRead = 0;

        std::size_t startingIndex = m_roundRobinIndex++;
        if (startingIndex >= length)
        {
            m_roundRobinIndex = startingIndex = 0;
        }

        for (std::size_t i = startingIndex; i < length && fragmentsRead < fragmentLimit; i++)
        {
            fragmentsRead += images[i].poll(fragmentHandler, fragmentLimit - fragmentsRead);
        }

        for (std::size_t i = 0; i < startingIndex && fragmentsRead < fragmentLimit; i++)
        {
            fragmentsRead += images[i].poll(fragmentHandler, fragmentLimit - fragmentsRead);
        }

        return fragmentsRead;
    }